

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall CLayerGroup::Mapping(CLayerGroup *this,float *pPoints)

{
  undefined4 uVar1;
  undefined4 uVar2;
  CEditor *pCVar3;
  
  pCVar3 = this->m_pMap->m_pEditor;
  uVar1 = pCVar3->m_pGraphics->m_ScreenWidth;
  uVar2 = pCVar3->m_pGraphics->m_ScreenHeight;
  CRenderTools::MapScreenToWorld
            (&pCVar3->m_RenderTools,pCVar3->m_WorldOffsetX,pCVar3->m_WorldOffsetY,
             (float)this->m_ParallaxX / 100.0,(float)this->m_ParallaxY / 100.0,
             (float)this->m_OffsetX,(float)this->m_OffsetY,(float)(int)uVar1 / (float)(int)uVar2,
             pCVar3->m_WorldZoom,pPoints);
  pCVar3 = this->m_pMap->m_pEditor;
  *pPoints = pCVar3->m_EditorOffsetX + *pPoints;
  pPoints[1] = pCVar3->m_EditorOffsetY + pPoints[1];
  pPoints[2] = pCVar3->m_EditorOffsetX + pPoints[2];
  pPoints[3] = pCVar3->m_EditorOffsetY + pPoints[3];
  return;
}

Assistant:

void CLayerGroup::Mapping(float *pPoints)
{
	m_pMap->m_pEditor->RenderTools()->MapScreenToWorld(
		m_pMap->m_pEditor->m_WorldOffsetX, m_pMap->m_pEditor->m_WorldOffsetY,
		m_ParallaxX/100.0f, m_ParallaxY/100.0f,
		m_OffsetX, m_OffsetY,
		m_pMap->m_pEditor->Graphics()->ScreenAspect(), m_pMap->m_pEditor->m_WorldZoom, pPoints);

	pPoints[0] += m_pMap->m_pEditor->m_EditorOffsetX;
	pPoints[1] += m_pMap->m_pEditor->m_EditorOffsetY;
	pPoints[2] += m_pMap->m_pEditor->m_EditorOffsetX;
	pPoints[3] += m_pMap->m_pEditor->m_EditorOffsetY;
}